

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libwebsockets.c
# Opt level: O3

char char_to_hex(char c)

{
  byte bVar1;
  char cVar2;
  
  bVar1 = c - 0x30;
  if (9 < bVar1) {
    if (5 < (byte)(c + 0x9fU)) {
      cVar2 = -1;
      if ((byte)(c + 0xbfU) < 6) {
        cVar2 = c + -0x37;
      }
      return cVar2;
    }
    bVar1 = c + 0xa9;
  }
  return bVar1;
}

Assistant:

signed char char_to_hex(const char c)
{
	if (c >= '0' && c <= '9')
		return (signed char)(c - '0');

	if (c >= 'a' && c <= 'f')
		return (signed char)(c - 'a' + 10);

	if (c >= 'A' && c <= 'F')
		return (signed char)(c - 'A' + 10);

	return (signed char)-1;
}